

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

int ply_get_property_info
              (p_ply_property property,char **name,e_ply_type *type,e_ply_type *length_type,
              e_ply_type *value_type)

{
  if (property != (p_ply_property)0x0) {
    if (name != (char **)0x0) {
      *name = property->name;
    }
    if (type != (e_ply_type *)0x0) {
      *type = property->type;
    }
    if (length_type != (e_ply_type *)0x0) {
      *length_type = property->length_type;
    }
    if (value_type != (e_ply_type *)0x0) {
      *value_type = property->value_type;
    }
    return 1;
  }
  __assert_fail("property",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x2ef,
                "int ply_get_property_info(p_ply_property, const char **, e_ply_type *, e_ply_type *, e_ply_type *)"
               );
}

Assistant:

int ply_get_property_info(p_ply_property property, const char** name,
        e_ply_type *type, e_ply_type *length_type, e_ply_type *value_type) {
    assert(property);
    if (name) *name = property->name;
    if (type) *type = property->type;
    if (length_type) *length_type = property->length_type;
    if (value_type) *value_type = property->value_type;
    return 1;

}